

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O0

int __thiscall musicBlock::findFreeChannel(musicBlock *this,uint flag,uint channel,uchar note)

{
  ulong uVar1;
  bool local_49;
  ulong magic;
  ulong uStack_30;
  uint bestvoice;
  ulong bestfit;
  uint i;
  uchar note_local;
  uint channel_local;
  uint flag_local;
  musicBlock *this_local;
  
  uStack_30 = 0;
  magic._4_4_ = 0;
  for (bestfit._0_4_ = 0; (uint)bestfit < this->io->OPLchannels; bestfit._0_4_ = (uint)bestfit + 1)
  {
    local_49 = false;
    if (this->channels[(uint)bestfit].note == note) {
      local_49 = this->channels[(uint)bestfit].channel == channel;
    }
    uVar1 = (long)(int)((this->channels[(uint)bestfit].flags & 0x80) << 0x18 |
                        (uint)local_49 << 0x1e | (this->channels[(uint)bestfit].flags & 2) << 0x1c)
            | this->MLtime - this->channels[(uint)bestfit].time & 0x1fffffff;
    if (uStack_30 < uVar1) {
      magic._4_4_ = (uint)bestfit;
      uStack_30 = uVar1;
    }
  }
  if (((flag & 1) == 0) || ((uStack_30 & 0x80000000) != 0)) {
    releaseChannel(this,magic._4_4_,1);
    this_local._4_4_ = magic._4_4_;
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int musicBlock::findFreeChannel(uint flag, uint channel, uchar note)
{
	uint i;

	ulong bestfit = 0;
	uint bestvoice = 0;

	for (i = 0; i < io->OPLchannels; ++i)
	{
		ulong magic;

		magic = ((channels[i].flags & CH_FREE) << 24) |
				((channels[i].note == note &&
					channels[i].channel == channel) << 30) |
				((channels[i].flags & CH_SUSTAIN) << 28) |
				((MLtime - channels[i].time) & 0x1fffffff);
		if (magic > bestfit)
		{
			bestfit = magic;
			bestvoice = i;
		}
	}
	if ((flag & 1) && !(bestfit & 0x80000000))
	{ // No free channels good enough
		return -1;
	}
	releaseChannel (bestvoice, 1);
	return bestvoice;
}